

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rabuilders_p.h
# Opt level: O0

Error __thiscall
asmjit::v1_14::RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder>::prepare
          (RACFGBuilderT<asmjit::v1_14::a64::RACFGBuilder> *this)

{
  Error EVar1;
  RABlock *pRVar2;
  BaseNode **in_RDI;
  Error _err;
  BaseNode *node;
  FuncNode *func;
  BaseRAPass *in_stack_ffffffffffffff88;
  undefined4 in_stack_ffffffffffffff98;
  BaseRAPass *this_00;
  BaseRAPass *this_01;
  undefined4 in_stack_ffffffffffffffb8;
  undefined4 in_stack_ffffffffffffffbc;
  
  this_01 = (BaseRAPass *)((BaseRAPass *)*in_RDI)->_func;
  this_00 = (BaseRAPass *)0x0;
  in_RDI[4] = (BaseNode *)this_01;
  pRVar2 = BaseRAPass::newBlockOrExistingAt
                     ((BaseRAPass *)*in_RDI,
                      (LabelNode *)CONCAT44(in_stack_ffffffffffffffbc,in_stack_ffffffffffffffb8),
                      in_RDI);
  in_RDI[3] = (BaseNode *)pRVar2;
  if (in_RDI[3] == (BaseNode *)0x0) {
    EVar1 = DebugUtils::errored(1);
  }
  else {
    *(uint *)(in_RDI[3] + 0xc) = *(uint *)(in_RDI[3] + 0xc) | 4;
    EVar1 = BaseRAPass::addExitBlock(in_stack_ffffffffffffff88,(RABlock *)0x1a6d8b);
    if (EVar1 == 0) {
      if (this_00 == this_01) {
        in_RDI[2] = in_RDI[3];
      }
      else {
        pRVar2 = BaseRAPass::newBlock(this_01,(BaseNode *)this_00);
        in_RDI[2] = (BaseNode *)pRVar2;
        if (in_RDI[2] == (BaseNode *)0x0) {
          EVar1 = DebugUtils::errored(1);
          return EVar1;
        }
      }
      *(undefined4 *)(in_RDI + 5) = 0;
      *(undefined4 *)((long)in_RDI + 0x2c) = *(undefined4 *)(*(long *)&this_01->field_0x338 + 0x30);
      *(undefined1 *)(in_RDI + 8) = 0;
      EVar1 = BaseRAPass::addBlock(this_00,(RABlock *)CONCAT44(EVar1,in_stack_ffffffffffffff98));
    }
  }
  return EVar1;
}

Assistant:

Error prepare() noexcept {
    FuncNode* func = _pass->func();
    BaseNode* node = nullptr;

    // Create entry and exit blocks.
    _funcNode = func;
    _retBlock = _pass->newBlockOrExistingAt(func->exitNode(), &node);

    if (ASMJIT_UNLIKELY(!_retBlock))
      return DebugUtils::errored(kErrorOutOfMemory);

    _retBlock->makeTargetable();
    ASMJIT_PROPAGATE(_pass->addExitBlock(_retBlock));

    if (node != func) {
      _curBlock = _pass->newBlock();
      if (ASMJIT_UNLIKELY(!_curBlock))
        return DebugUtils::errored(kErrorOutOfMemory);
    }
    else {
      // Function that has no code at all.
      _curBlock = _retBlock;
    }

    // Reset everything we may need.
    _blockRegStats.reset();
    _exitLabelId = func->exitNode()->labelId();

    // Initially we assume there is no code in the function body.
    _hasCode = false;

    return _pass->addBlock(_curBlock);
  }